

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnDataSegmentData
          (BinaryReaderInterp *this,Index index,void *src_data,Address size)

{
  reference this_00;
  uchar *__dest;
  DataDesc *dst_data;
  Address size_local;
  void *src_data_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  this_00 = std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::back
                      (&this->module_->datas);
  if (size != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this_00->data,size);
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this_00->data);
    memcpy(__dest,src_data,size);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnDataSegmentData(Index index,
                                             const void* src_data,
                                             Address size) {
  DataDesc& dst_data = module_.datas.back();
  if (size > 0) {
    dst_data.data.resize(size);
    memcpy(dst_data.data.data(), src_data, size);
  }
  return Result::Ok;
}